

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  u64 uVar4;
  u64 nBytes;
  u8 *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  size_t __n;
  int unaff_R14D;
  u8 *aNext;
  u8 *local_38;
  
  lVar1 = p->iReadOff;
  if (p->aMap != (u8 *)0x0) {
    *ppOut = p->aMap + lVar1;
    p->iReadOff = nByte + lVar1;
    return 0;
  }
  iVar9 = p->nBuffer;
  lVar7 = lVar1 % (long)iVar9;
  if (lVar7 == 0) {
    lVar8 = p->iEof - lVar1;
    iVar6 = (int)lVar8;
    if (iVar9 < lVar8) {
      iVar6 = iVar9;
    }
    unaff_R14D = (*p->pFd->pMethods->xRead)(p->pFd,p->aBuffer,iVar6,lVar1);
    if (unaff_R14D != 0) {
      return unaff_R14D;
    }
  }
  __n = (long)p->nBuffer - (long)(int)lVar7;
  iVar9 = nByte - (int)__n;
  if (iVar9 == 0 || nByte < (int)__n) {
    *ppOut = p->aBuffer + lVar7;
    p->iReadOff = p->iReadOff + (long)nByte;
    return 0;
  }
  iVar6 = p->nAlloc;
  if (iVar6 < nByte) {
    uVar4 = 0x80;
    if (0x3f < iVar6) {
      uVar4 = (long)iVar6 * 2;
    }
    do {
      nBytes = uVar4;
      uVar4 = nBytes * 2;
    } while ((long)nBytes < (long)nByte);
    puVar5 = (u8 *)sqlite3Realloc(p->aAlloc,nBytes);
    if (puVar5 == (u8 *)0x0) {
      iVar3 = 7;
LAB_0016a4d3:
      unaff_R14D = iVar3;
      bVar2 = false;
      goto LAB_0016a4e5;
    }
    p->nAlloc = (int)nBytes;
    p->aAlloc = puVar5;
  }
  memcpy(p->aAlloc,p->aBuffer + lVar7,__n);
  p->iReadOff = p->iReadOff + __n;
  for (; 0 < iVar9; iVar9 = iVar9 - iVar6) {
    iVar6 = p->nBuffer;
    if (iVar9 < p->nBuffer) {
      iVar6 = iVar9;
    }
    iVar3 = vdbePmaReadBlob(p,iVar6,&local_38);
    if (iVar3 != 0) goto LAB_0016a4d3;
    memcpy(p->aAlloc + (nByte - iVar9),local_38,(long)iVar6);
  }
  *ppOut = p->aAlloc;
  bVar2 = true;
LAB_0016a4e5:
  if (bVar2) {
    return 0;
  }
  return unaff_R14D;
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf;

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      sqlite3_int64 nNew = MAX(128, 2*(sqlite3_int64)p->nAlloc);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}